

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

_Bool is_mode_ref_delta_meaningful(AV1_COMMON *cm)

{
  RefCntBuffer *pRVar1;
  long in_RDI;
  int i_1;
  int i;
  int8_t last_mode_deltas [2];
  int8_t last_ref_deltas [8];
  RefCntBuffer *buf;
  loopfilter *lf;
  int local_34;
  int local_30;
  undefined2 local_2a;
  AV1_COMMON *in_stack_ffffffffffffffd8;
  
  if (*(char *)(in_RDI + 0x5a15) != '\0') {
    pRVar1 = get_primary_ref_frame_buf(in_stack_ffffffffffffffd8);
    if (pRVar1 == (RefCntBuffer *)0x0) {
      av1_set_default_ref_deltas(&stack0xffffffffffffffd8);
      av1_set_default_mode_deltas((int8_t *)&local_2a);
    }
    else {
      local_2a = *(undefined2 *)pRVar1->mode_deltas;
    }
    for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
      if (*(char *)(in_RDI + 0x5a16 + (long)local_30) != (&stack0xffffffffffffffd8)[local_30]) {
        return true;
      }
    }
    for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
      if (*(char *)(in_RDI + 0x5a1e + (long)local_34) != *(char *)((long)&local_2a + (long)local_34)
         ) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool is_mode_ref_delta_meaningful(AV1_COMMON *cm) {
  struct loopfilter *lf = &cm->lf;
  if (!lf->mode_ref_delta_update) {
    return 0;
  }
  const RefCntBuffer *buf = get_primary_ref_frame_buf(cm);
  int8_t last_ref_deltas[REF_FRAMES];
  int8_t last_mode_deltas[MAX_MODE_LF_DELTAS];
  if (buf == NULL) {
    av1_set_default_ref_deltas(last_ref_deltas);
    av1_set_default_mode_deltas(last_mode_deltas);
  } else {
    memcpy(last_ref_deltas, buf->ref_deltas, REF_FRAMES);
    memcpy(last_mode_deltas, buf->mode_deltas, MAX_MODE_LF_DELTAS);
  }
  for (int i = 0; i < REF_FRAMES; i++) {
    if (lf->ref_deltas[i] != last_ref_deltas[i]) {
      return true;
    }
  }
  for (int i = 0; i < MAX_MODE_LF_DELTAS; i++) {
    if (lf->mode_deltas[i] != last_mode_deltas[i]) {
      return true;
    }
  }
  return false;
}